

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<VCFilter>::Inserter::insertOne(Inserter *this,qsizetype pos,VCFilter *t)

{
  qsizetype in_RSI;
  VCFilter *in_RDI;
  qsizetype i;
  VCFilter *in_stack_ffffffffffffffe0;
  VCFilter *this_00;
  
  setup((Inserter *)in_RDI,in_RSI,1);
  if ((in_RDI->Filter).d.d == (Data *)0x0) {
    VCFilter::VCFilter(in_stack_ffffffffffffffe0,in_RDI);
    (in_RDI->Name).d.size = (in_RDI->Name).d.size + 1;
    for (this_00 = (VCFilter *)0x0; this_00 != (VCFilter *)(in_RDI->Filter).d.size;
        this_00 = (VCFilter *)((long)&this_00[-1].CompilerTool.config + 7)) {
      VCFilter::operator=(this_00,in_RDI);
    }
    VCFilter::operator=(this_00,in_RDI);
  }
  else {
    VCFilter::VCFilter(in_stack_ffffffffffffffe0,in_RDI);
    (in_RDI->Name).d.size = (in_RDI->Name).d.size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }